

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void rf_draw_triangle(rf_vec2 v1,rf_vec2 v2,rf_vec2 v3,rf_color color)

{
  rf_render_batch *prVar1;
  long lVar2;
  rf_vertex_buffer *prVar3;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  prVar1 = (rf__ctx->field_0).current_batch;
  lVar2 = prVar1->current_buffer;
  prVar3 = prVar1->vertex_buffers;
  if (prVar3[lVar2].elements_count * 4 <= prVar3[lVar2].v_counter + 4) {
    rf_gfx_draw();
  }
  rf_gfx_begin(RF_TRIANGLES);
  rf_gfx_color4ub(color.r,color.g,color.b,color.a);
  local_58 = v1.x;
  fStack_54 = v1.y;
  rf_gfx_vertex3f(local_58,fStack_54,((rf__ctx->field_0).current_batch)->current_depth);
  local_48 = v2.x;
  fStack_44 = v2.y;
  rf_gfx_vertex3f(local_48,fStack_44,((rf__ctx->field_0).current_batch)->current_depth);
  local_38 = v3.x;
  fStack_34 = v3.y;
  rf_gfx_vertex3f(local_38,fStack_34,((rf__ctx->field_0).current_batch)->current_depth);
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_triangle(rf_vec2 v1, rf_vec2 v2, rf_vec2 v3, rf_color color)
{
    if (rf_gfx_check_buffer_limit(4)) rf_gfx_draw();
    rf_gfx_begin(RF_TRIANGLES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_vertex2f(v1.x, v1.y);
    rf_gfx_vertex2f(v2.x, v2.y);
    rf_gfx_vertex2f(v3.x, v3.y);
    rf_gfx_end();

}